

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::BrIf(w3Interp *this)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar1 = w3Stack::pop_u32(&this->super_w3Stack);
  uVar2 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  if (uVar1 != 0) {
    printf("BrIfTaken condition:%X label:%X\n",(ulong)uVar1,uVar2);
    Br(this);
    return;
  }
  printf("BrIfNotTaken condition:%X label:%X\n",0,uVar2);
  return;
}

Assistant:

INTERP (BrIf)
{
    //DumpStack ("brIfStart");

    const uint32_t condition = pop_u32 ();

    if (condition)
    {
        printf ("BrIfTaken condition:%X label:%X\n", condition, instr->u32);
        Br ();
    }
    else
    {
        printf ("BrIfNotTaken condition:%X label:%X\n", condition, instr->u32);
    }
    //DumpStack ("brIfEnd");
}